

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::SumBatches::backward_impl
          (SumBatches *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  if (i != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x39d,
                  "virtual void cnn::SumBatches::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if ((dEdxi->d).bd != 0) {
    uVar15 = 0;
    do {
      Tensor::operator*(&local_48,dEdf);
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      uVar2 = (dEdxi->d).nd;
      iVar24 = 1;
      if ((ulong)uVar2 != 0) {
        auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar21 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar22 = vpbroadcastq_avx512f();
          auVar23 = vmovdqa64_avx512f(auVar20);
          auVar20 = vporq_avx512f(auVar22,auVar19);
          auVar22 = vporq_avx512f(auVar22,auVar18);
          uVar6 = vpcmpuq_avx512f(auVar22,auVar21,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar20,auVar21,2);
          bVar8 = (byte)uVar6;
          uVar16 = CONCAT11(bVar8,bVar7);
          auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar9));
          auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar20._4_4_;
          auVar22._0_4_ = (uint)(bVar7 & 1) * auVar20._0_4_;
          auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar20._8_4_;
          auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar20._12_4_;
          auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar20._16_4_;
          auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar20._20_4_;
          auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar20._24_4_;
          auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar20._28_4_;
          auVar22._32_4_ = (uint)(bVar8 & 1) * auVar20._32_4_;
          auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar20._36_4_;
          auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar20._40_4_;
          auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar20._44_4_;
          auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar20._48_4_;
          auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar20._52_4_;
          auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar20._56_4_;
          auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar20._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar20 = vpmulld_avx512f(auVar22,auVar23);
        } while (((ulong)uVar2 + 0xf & 0xfffffffffffffff0) != uVar9);
        auVar18 = vmovdqa32_avx512f(auVar20);
        auVar19._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar23._0_4_
        ;
        bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar19._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar23._4_4_;
        bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar19._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar23._8_4_;
        bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar19._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar23._12_4_;
        bVar3 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar19._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar23._16_4_;
        bVar3 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar19._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar23._20_4_;
        bVar3 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar19._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar23._24_4_;
        bVar3 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar19._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar23._28_4_;
        auVar19._32_4_ =
             (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar19._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar23._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar19._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar23._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar19._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar23._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar19._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar23._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar19._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar23._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar19._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar23._56_4_;
        auVar19._60_4_ =
             (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar23._60_4_;
        auVar17 = vextracti64x4_avx512f(auVar19,1);
        auVar18 = vpmulld_avx512f(auVar19,ZEXT3264(auVar17));
        auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        iVar24 = auVar4._0_4_;
      }
      uVar10 = (ulong)(dEdxi->d).d[0];
      uVar9 = (ulong)(dEdxi->d).d[1];
      if (uVar2 < 2) {
        uVar9 = 1;
      }
      if ((local_48.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != uVar10) ||
         (local_48.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != uVar9)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      uVar9 = uVar9 * uVar10;
      pfVar1 = dEdxi->v + (uVar15 % (dEdxi->d).bd) * iVar24;
      uVar10 = uVar9;
      if ((((ulong)pfVar1 & 3) == 0) &&
         (uVar10 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar9 <= uVar10)) {
        uVar10 = uVar9;
      }
      uVar13 = uVar9 - uVar10;
      uVar11 = uVar13 + 0xf;
      if (-1 < (long)uVar13) {
        uVar11 = uVar13;
      }
      if (uVar10 != 0) {
        uVar14 = 0;
        do {
          pfVar1[uVar14] =
               pfVar1[uVar14] +
               local_48.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
      }
      lVar12 = (uVar11 & 0xfffffffffffffff0) + uVar10;
      if (0xf < (long)uVar13) {
        do {
          auVar18 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar1 + uVar10),
                                   *(undefined1 (*) [64])
                                    (local_48.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_data + uVar10));
          *(undefined1 (*) [64])(pfVar1 + uVar10) = auVar18;
          uVar10 = uVar10 + 0x10;
        } while ((long)uVar10 < lVar12);
      }
      if (lVar12 < (long)uVar9) {
        do {
          pfVar1[lVar12] =
               pfVar1[lVar12] +
               local_48.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[lVar12];
          lVar12 = lVar12 + 1;
        } while (uVar9 - lVar12 != 0);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (dEdxi->d).bd);
  }
  return;
}

Assistant:

void SumBatches::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  assert(i == 0);
#if HAVE_CUDA
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v + i * dEdxi.d.batch_size(), 1));
#else
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    dEdxi.batch_matrix(i) += *dEdf;
#endif
}